

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,AddressType addr_type,ByteData160 *hash)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CfdException *this_00;
  string local_78;
  SchnorrPubkey *local_58;
  Pubkey *local_50;
  ByteData *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  this->type_ = type;
  this->addr_type_ = addr_type;
  this->witness_ver_ = kVersionNone;
  paVar1 = &(this->address_).field_2;
  (this->address_)._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  local_40 = paVar1;
  local_38 = &this->address_;
  ByteData160::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,hash);
  ByteData::ByteData(&this->hash_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78
                    );
  if (local_78._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  local_50 = &this->pubkey_;
  local_48 = &this->hash_;
  Pubkey::Pubkey(local_50);
  local_58 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_58);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  if ((addr_type - kP2shP2wshAddress < 2) || (addr_type == kP2shAddress)) {
    CalculateP2SH(this,hash,'\0');
  }
  else {
    if (addr_type != kP2pkhAddress) {
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Support addressType is p2pkh or p2sh","");
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_78);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    CalculateP2PKH(this,hash,'\0');
  }
  return;
}

Assistant:

Address::Address(NetType type, AddressType addr_type, const ByteData160& hash)
    : type_(type),
      addr_type_(addr_type),
      witness_ver_(kVersionNone),
      address_(""),
      hash_(hash.GetBytes()),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  if (addr_type == kP2pkhAddress) {
    CalculateP2PKH(hash);
  } else if (
      (addr_type == kP2shAddress) || (addr_type == kP2shP2wshAddress) ||
      (addr_type == kP2shP2wpkhAddress)) {
    CalculateP2SH(hash);
  } else {
    throw CfdException(
        kCfdIllegalArgumentError, "Support addressType is p2pkh or p2sh");
  }
}